

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNormalizer.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DOMNormalizer::InScopeNamespaces::Scope::addOrChangeBinding
          (Scope *this,XMLCh *prefix,XMLCh *uri,MemoryManager *manager)

{
  XMLSize_t XVar1;
  bool bVar2;
  int iVar3;
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *pRVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ushort *puVar5;
  ulong uVar6;
  XMLSize_t XVar7;
  char16_t *pcVar8;
  ushort *puVar9;
  RefHashTableBucketElem<char16_t> *pRVar10;
  ushort uVar11;
  XMLCh *pXVar12;
  XMLCh XVar13;
  RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher> uriEnumer;
  RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher> preEnumer;
  RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher> local_90;
  RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher> local_60;
  
  if (this->fUriHash == (RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *)0x0) {
    pRVar4 = (RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *)
             XMemory::operator_new(0x38,manager);
    pRVar4->fMemoryManager = manager;
    pRVar4->fAdoptedElems = false;
    pRVar4->fBucketList = (RefHashTableBucketElem<char16_t> **)0x0;
    pRVar4->fHashModulus = 10;
    pRVar4->fInitialModulus = 10;
    pRVar4->fCount = 0;
    iVar3 = (*manager->_vptr_MemoryManager[3])(manager,0x50);
    pRVar4->fBucketList = (RefHashTableBucketElem<char16_t> **)CONCAT44(extraout_var,iVar3);
    XVar1 = pRVar4->fHashModulus;
    if (XVar1 != 0) {
      XVar7 = 0;
      do {
        pRVar4->fBucketList[XVar7] = (RefHashTableBucketElem<char16_t> *)0x0;
        XVar7 = XVar7 + 1;
      } while (XVar1 != XVar7);
    }
    this->fPrefixHash = pRVar4;
    pRVar4 = (RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *)
             XMemory::operator_new(0x38,manager);
    pRVar4->fMemoryManager = manager;
    pRVar4->fAdoptedElems = false;
    pRVar4->fBucketList = (RefHashTableBucketElem<char16_t> **)0x0;
    pRVar4->fHashModulus = 10;
    pRVar4->fInitialModulus = 10;
    pRVar4->fCount = 0;
    iVar3 = (*manager->_vptr_MemoryManager[3])(manager,0x50);
    pRVar4->fBucketList = (RefHashTableBucketElem<char16_t> **)CONCAT44(extraout_var_00,iVar3);
    XVar1 = pRVar4->fHashModulus;
    if (XVar1 != 0) {
      XVar7 = 0;
      do {
        pRVar4->fBucketList[XVar7] = (RefHashTableBucketElem<char16_t> *)0x0;
        XVar7 = XVar7 + 1;
      } while (XVar1 != XVar7);
    }
    this->fUriHash = pRVar4;
    if (this->fBaseScopeWithBindings != (Scope *)0x0) {
      RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher>::RefHashTableOfEnumerator
                (&local_60,this->fBaseScopeWithBindings->fPrefixHash,false,manager);
      while ((local_60.fCurElem != (RefHashTableBucketElem<char16_t> *)0x0 ||
             (local_60.fCurHash != (local_60.fToEnum)->fHashModulus))) {
        puVar5 = (ushort *)
                 RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher>::nextElementKey
                           (&local_60);
        pRVar4 = this->fBaseScopeWithBindings->fPrefixHash;
        if ((puVar5 == (ushort *)0x0) || (uVar6 = (ulong)*puVar5, uVar6 == 0)) {
          uVar6 = 0;
        }
        else {
          uVar11 = puVar5[1];
          if (uVar11 != 0) {
            puVar9 = puVar5 + 2;
            do {
              uVar6 = (ulong)uVar11 + (uVar6 >> 0x18) + uVar6 * 0x26;
              uVar11 = *puVar9;
              puVar9 = puVar9 + 1;
            } while (uVar11 != 0);
          }
          uVar6 = uVar6 % pRVar4->fHashModulus;
        }
        pRVar10 = pRVar4->fBucketList[uVar6];
        if (pRVar10 != (RefHashTableBucketElem<char16_t> *)0x0) {
          do {
            bVar2 = StringHasher::equals((StringHasher *)&pRVar4->field_0x30,puVar5,pRVar10->fKey);
            if (bVar2) {
              pcVar8 = pRVar10->fData;
              goto LAB_00275360;
            }
            pRVar10 = pRVar10->fNext;
          } while (pRVar10 != (RefHashTableBucketElem<char16_t> *)0x0);
        }
        pcVar8 = (char16_t *)0x0;
LAB_00275360:
        RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put(this->fPrefixHash,puVar5,pcVar8);
      }
      RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher>::RefHashTableOfEnumerator
                (&local_90,this->fBaseScopeWithBindings->fUriHash,false,manager);
      while ((local_90.fCurElem != (RefHashTableBucketElem<char16_t> *)0x0 ||
             (local_90.fCurHash != (local_90.fToEnum)->fHashModulus))) {
        puVar5 = (ushort *)
                 RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher>::nextElementKey
                           (&local_90);
        pRVar4 = this->fBaseScopeWithBindings->fUriHash;
        if ((puVar5 == (ushort *)0x0) || (uVar6 = (ulong)*puVar5, uVar6 == 0)) {
          uVar6 = 0;
        }
        else {
          uVar11 = puVar5[1];
          if (uVar11 != 0) {
            puVar9 = puVar5 + 2;
            do {
              uVar6 = (ulong)uVar11 + (uVar6 >> 0x18) + uVar6 * 0x26;
              uVar11 = *puVar9;
              puVar9 = puVar9 + 1;
            } while (uVar11 != 0);
          }
          uVar6 = uVar6 % pRVar4->fHashModulus;
        }
        pRVar10 = pRVar4->fBucketList[uVar6];
        if (pRVar10 != (RefHashTableBucketElem<char16_t> *)0x0) {
          do {
            bVar2 = StringHasher::equals((StringHasher *)&pRVar4->field_0x30,puVar5,pRVar10->fKey);
            if (bVar2) {
              pcVar8 = pRVar10->fData;
              goto LAB_00275441;
            }
            pRVar10 = pRVar10->fNext;
          } while (pRVar10 != (RefHashTableBucketElem<char16_t> *)0x0);
        }
        pcVar8 = (char16_t *)0x0;
LAB_00275441:
        RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put(this->fUriHash,puVar5,pcVar8);
      }
      RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher>::~RefHashTableOfEnumerator
                (&local_90);
      RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher>::~RefHashTableOfEnumerator
                (&local_60);
    }
  }
  pRVar4 = this->fPrefixHash;
  if ((prefix == (XMLCh *)0x0) || (uVar6 = (ulong)(ushort)*prefix, uVar6 == 0)) {
    uVar6 = 0;
  }
  else {
    XVar13 = prefix[1];
    if (XVar13 != L'\0') {
      pXVar12 = prefix + 2;
      do {
        uVar6 = (ulong)(ushort)XVar13 + (uVar6 >> 0x18) + uVar6 * 0x26;
        XVar13 = *pXVar12;
        pXVar12 = pXVar12 + 1;
      } while (XVar13 != L'\0');
    }
    uVar6 = uVar6 % pRVar4->fHashModulus;
  }
  pRVar10 = pRVar4->fBucketList[uVar6];
  if (pRVar10 != (RefHashTableBucketElem<char16_t> *)0x0) {
    do {
      bVar2 = StringHasher::equals((StringHasher *)&pRVar4->field_0x30,prefix,pRVar10->fKey);
      if (bVar2) {
        if (pRVar10->fData != (char16_t *)0x0) {
          RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::removeKey
                    (this->fUriHash,pRVar10->fData);
        }
        break;
      }
      pRVar10 = pRVar10->fNext;
    } while (pRVar10 != (RefHashTableBucketElem<char16_t> *)0x0);
  }
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put(this->fPrefixHash,prefix,uri);
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put(this->fUriHash,uri,prefix);
  return;
}

Assistant:

void DOMNormalizer::InScopeNamespaces::Scope::addOrChangeBinding(const XMLCh *prefix, const XMLCh *uri,
                                                                 MemoryManager* const manager) {
    //initialize and copy forward now we need to
    if(!fUriHash) {
        fPrefixHash = new (manager) RefHashTableOf<XMLCh>(10, (bool) false, manager);
        fUriHash = new (manager) RefHashTableOf<XMLCh>(10, (bool) false, manager);

        if(fBaseScopeWithBindings) {
            RefHashTableOfEnumerator<XMLCh> preEnumer(fBaseScopeWithBindings->fPrefixHash, false, manager);
            while(preEnumer.hasMoreElements()) {
                const XMLCh* prefix = (XMLCh*) preEnumer.nextElementKey();
                const XMLCh* uri  = fBaseScopeWithBindings->fPrefixHash->get((void*)prefix);

                //have to cast here because otherwise we have delete problems under windows :(
                fPrefixHash->put((void *)prefix, (XMLCh*)uri);
            }

            RefHashTableOfEnumerator<XMLCh> uriEnumer(fBaseScopeWithBindings->fUriHash, false, manager);
            while(uriEnumer.hasMoreElements()) {
                const XMLCh* uri = (XMLCh*) uriEnumer.nextElementKey();
                const XMLCh* prefix  = fBaseScopeWithBindings->fUriHash->get((void*)uri);

                //have to cast here because otherwise we have delete problems under windows :(
                fUriHash->put((void *)uri, (XMLCh*)prefix);
            }
        }
    }

    const XMLCh *oldUri = fPrefixHash->get(prefix);
    if(oldUri) {
        fUriHash->removeKey(oldUri);
    }

    fPrefixHash->put((void *)prefix, (XMLCh*)uri);
    fUriHash->put((void *)uri, (XMLCh*)prefix);
}